

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Config::Config(Config *this,ConfigData *data)

{
  undefined8 uVar1;
  bool bVar2;
  streambuf *psVar3;
  size_type sVar4;
  const_reference pvVar5;
  bool local_19a;
  TestCaseFilter local_158;
  byte local_12b;
  byte local_12a;
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [32];
  string local_e0 [8];
  string filter;
  ulong local_c0;
  size_t i_1;
  TestCaseFilters filters;
  size_t i;
  string groupName;
  ConfigData *data_local;
  Config *this_local;
  
  SharedImpl<Catch::IConfig>::SharedImpl(&this->super_SharedImpl<Catch::IConfig>);
  (this->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__Config_00210528;
  ConfigData::ConfigData(&this->m_data,data);
  Stream::Stream(&this->m_stream);
  psVar3 = (streambuf *)std::ios::rdbuf();
  std::ostream::ostream(&this->m_os,psVar3);
  std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::vector
            (&this->m_filterSets);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&data->testsOrTags);
  if (!bVar2) {
    std::__cxx11::string::string((string *)&i);
    for (filters._96_8_ = 0; uVar1 = filters._96_8_,
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&data->testsOrTags), (ulong)uVar1 < sVar4;
        filters._96_8_ = filters._96_8_ + 1) {
      if (filters._96_8_ != 0) {
        std::__cxx11::string::operator+=((string *)&i," ");
      }
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&data->testsOrTags,filters._96_8_);
      std::__cxx11::string::operator+=((string *)&i,(string *)pvVar5);
    }
    TestCaseFilters::TestCaseFilters((TestCaseFilters *)&i_1,(string *)&i);
    for (local_c0 = 0;
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&data->testsOrTags), local_c0 < sVar4; local_c0 = local_c0 + 1) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&data->testsOrTags,local_c0);
      std::__cxx11::string::string(local_e0,(string *)pvVar5);
      std::allocator<char>::allocator();
      local_12a = 0;
      local_12b = 0;
      std::__cxx11::string::string(local_100,"[",&local_101);
      bVar2 = startsWith((string *)local_e0,(string *)local_100);
      local_19a = true;
      if (!bVar2) {
        std::allocator<char>::allocator();
        local_12a = 1;
        std::__cxx11::string::string(local_128,"~[",&local_129);
        local_12b = 1;
        local_19a = startsWith((string *)local_e0,(string *)local_128);
      }
      if ((local_12b & 1) != 0) {
        std::__cxx11::string::~string(local_128);
      }
      if ((local_12a & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_129);
      }
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      if (local_19a == false) {
        TestCaseFilter::TestCaseFilter(&local_158,(string *)local_e0,AutoDetectBehaviour);
        TestCaseFilters::addFilter((TestCaseFilters *)&i_1,&local_158);
        TestCaseFilter::~TestCaseFilter(&local_158);
      }
      else {
        TestCaseFilters::addTags((TestCaseFilters *)&i_1,(string *)local_e0);
      }
      std::__cxx11::string::~string(local_e0);
    }
    std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::push_back
              (&this->m_filterSets,(value_type *)&i_1);
    TestCaseFilters::~TestCaseFilters((TestCaseFilters *)&i_1);
    std::__cxx11::string::~string((string *)&i);
  }
  return;
}

Assistant:

Config( ConfigData const& data )
        :   m_data( data ),
            m_os( std::cout.rdbuf() )
        {
            if( !data.testsOrTags.empty() ) {
                std::string groupName;
                for( std::size_t i = 0; i < data.testsOrTags.size(); ++i ) {
                    if( i != 0 )
                        groupName += " ";
                    groupName += data.testsOrTags[i];
                }
                TestCaseFilters filters( groupName );
                for( std::size_t i = 0; i < data.testsOrTags.size(); ++i ) {
                    std::string filter = data.testsOrTags[i];
                    if( startsWith( filter, "[" ) || startsWith( filter, "~[" ) )
                        filters.addTags( filter );
                    else
                        filters.addFilter( TestCaseFilter( filter ) );
                }
                m_filterSets.push_back( filters );
            }
        }